

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_handler.cc
# Opt level: O1

void __thiscall
helix::nasdaq::itch50_handler::process_msg(itch50_handler *this,itch50_order_cancel *m)

{
  order_book *this_00;
  uint uVar1;
  undefined8 uVar2;
  __hash_code __code;
  _Hash_node_base *p_Var3;
  ulong uVar4;
  ulong uVar5;
  _Hash_node_base *p_Var6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  event local_60;
  
  p_Var3 = (_Hash_node_base *)(ulong)m->StockLocate;
  uVar5 = (this->order_book_id_map)._M_h._M_bucket_count;
  uVar4 = (ulong)p_Var3 % uVar5;
  p_Var7 = (this->order_book_id_map)._M_h._M_buckets[uVar4 & 0xffffffff];
  p_Var8 = (__node_base_ptr)0x0;
  if ((p_Var7 != (__node_base_ptr)0x0) &&
     (p_Var6 = p_Var7->_M_nxt, p_Var8 = p_Var7, p_Var7->_M_nxt[1]._M_nxt != p_Var3)) {
    while (p_Var7 = p_Var6, p_Var6 = p_Var7->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
      p_Var8 = (__node_base_ptr)0x0;
      if (((ulong)p_Var6[1]._M_nxt % uVar5 != uVar4) ||
         (p_Var8 = p_Var7, p_Var6[1]._M_nxt == p_Var3)) goto LAB_00114081;
    }
    p_Var8 = (__node_base_ptr)0x0;
  }
LAB_00114081:
  if (p_Var8 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var8->_M_nxt;
  }
  if (p_Var3 != (_Hash_node_base *)0x0) {
    this_00 = (order_book *)(p_Var3 + 2);
    uVar1 = m->CanceledShares;
    order_book::cancel(this_00,m->OrderReferenceNumber,
                       (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                              uVar1 << 0x18));
    uVar5 = (ulong)*(ushort *)&m->field_0x9 << 0x20;
    uVar4 = (ulong)*(uint6 *)&m->field_0x5;
    p_Var6 = (_Hash_node_base *)
             (((uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
               (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 |
              uVar4 << 0x38) >> 0x10);
    p_Var3[6]._M_nxt = p_Var6;
    make_ob_event(&local_60,(string *)this_00,(uint64_t)p_Var6,this_00,0);
    if ((this->_process_event).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar2 = std::__throw_bad_function_call();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._symbol._M_dataplus._M_p != &local_60._symbol.field_2) {
        operator_delete(local_60._symbol._M_dataplus._M_p,
                        local_60._symbol.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar2);
    }
    (*(this->_process_event)._M_invoker)((_Any_data *)this,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._symbol._M_dataplus._M_p != &local_60._symbol.field_2) {
      operator_delete(local_60._symbol._M_dataplus._M_p,
                      local_60._symbol.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void itch50_handler::process_msg(const itch50_order_cancel* m)
{
    auto it = order_book_id_map.find(m->StockLocate);
    if (it != order_book_id_map.end()) {
        auto& ob = it->second;
        ob.cancel(m->OrderReferenceNumber, be32toh(m->CanceledShares));
        auto timestamp = itch50_timestamp(m->Timestamp);
        ob.set_timestamp(timestamp);
        _process_event(make_ob_event(ob.symbol(), timestamp, &ob));
    }
}